

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

char * cimg_library::cimg::load_network
                 (char *url,char *filename_local,uint timeout,bool try_fallback)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  FILE *pFVar4;
  size_t sVar5;
  long lVar6;
  CImgArgumentException *this;
  CImgIOException *this_00;
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  ulong uVar7;
  CImg<char> command;
  CImg<char> ext;
  
  if (url == (char *)0x0) {
    this = (CImgArgumentException *)
           __cxa_allocate_exception
                     (0x10,filename_local,CONCAT44(in_register_00000014,timeout),
                      CONCAT71(in_register_00000009,try_fallback));
    CImgArgumentException::CImgArgumentException
              (this,"cimg::load_network(): Specified URL is (null).");
LAB_0011b8e8:
    __cxa_throw(this,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  if (filename_local == (char *)0x0) {
    this = (CImgArgumentException *)
           __cxa_allocate_exception
                     (0x10,0,CONCAT44(in_register_00000014,timeout),
                      CONCAT71(in_register_00000009,try_fallback));
    CImgArgumentException::CImgArgumentException
              (this,"cimg::load_network(): Specified destination string is (null).");
    goto LAB_0011b8e8;
  }
  pcVar2 = split_filename(url,(char *)0x0);
  CImg<char>::string(&ext,pcVar2 + -(ulong)(url < pcVar2 && *pcVar2 != '\0'),true,false);
  *filename_local = '\0';
  if ((ext._width < 0x11) && (iVar1 = strncasecmp(ext._data,"cgi",3), iVar1 != 0)) {
    strwindows_reserved(ext._data,'_');
  }
  else {
    *ext._data = '\0';
  }
  while( true ) {
    pcVar2 = temporary_path((char *)0x0,false);
    pcVar3 = filenamerand();
    snprintf(filename_local,0x100,"%s%c%s%s",pcVar2,0x2f,pcVar3,ext._data);
    pFVar4 = ::fopen(filename_local,"rb");
    if (pFVar4 == (FILE *)0x0) break;
    fclose(pFVar4);
  }
  sVar5 = strlen(url);
  CImg<char>::CImg(&command,(int)sVar5 + 0x40,1,1,1);
  pcVar2 = command._data;
  uVar7 = (ulong)command._width;
  if (timeout == 0) {
    pcVar3 = curl_path((char *)0x0,false);
    snprintf(pcVar2,uVar7,"%s -f --silent --compressed -o \"%s\" \"%s\"",pcVar3,filename_local,url);
  }
  else {
    pcVar3 = curl_path((char *)0x0,false);
    snprintf(pcVar2,uVar7,"%s -m %u -f --silent --compressed -o \"%s\" \"%s\"",pcVar3,(ulong)timeout
             ,filename_local,url);
  }
  system(command._data);
  pFVar4 = ::fopen(filename_local,"rb");
  pcVar2 = command._data;
  if (pFVar4 == (FILE *)0x0) {
    uVar7 = (ulong)command._width;
    if (timeout == 0) {
      pcVar3 = wget_path((char *)0x0,false);
      snprintf(pcVar2,uVar7,"%s -q -r -l 0 --no-cache -O \"%s\" \"%s\"",pcVar3,filename_local,url);
    }
    else {
      pcVar3 = wget_path((char *)0x0,false);
      snprintf(pcVar2,uVar7,"%s -T %u -q -r -l 0 --no-cache -O \"%s\" \"%s\"",pcVar3,(ulong)timeout,
               filename_local,url);
    }
    system(command._data);
    pFVar4 = ::fopen(filename_local,"rb");
    if (pFVar4 == (FILE *)0x0) {
      this_00 = (CImgIOException *)__cxa_allocate_exception(0x10);
      CImgIOException::CImgIOException
                (this_00,
                 "cimg::load_network(): Failed to load file \'%s\' with external commands \'wget\' or \'curl\'."
                 ,url);
      goto LAB_0011b93e;
    }
    fclose(pFVar4);
    snprintf(command._data,(ulong)command._width,"%s.gz",filename_local);
    rename(filename_local,command._data);
    pcVar2 = command._data;
    uVar7 = (ulong)command._width;
    pcVar3 = gunzip_path((char *)0x0,false);
    snprintf(pcVar2,uVar7,"%s --quiet \"%s.gz\"",pcVar3,filename_local);
    system(command._data);
    pFVar4 = ::fopen(filename_local,"rb");
    if (pFVar4 == (FILE *)0x0) {
      snprintf(command._data,(ulong)command._width,"%s.gz",filename_local);
      rename(command._data,filename_local);
      pFVar4 = ::fopen(filename_local,"rb");
    }
  }
  fseek(pFVar4,0,2);
  lVar6 = ftell(pFVar4);
  if (0 < lVar6) {
    fclose(pFVar4);
    CImg<char>::~CImg(&command);
    CImg<char>::~CImg(&ext);
    return filename_local;
  }
  this_00 = (CImgIOException *)__cxa_allocate_exception(0x10);
  CImgIOException::CImgIOException
            (this_00,
             "cimg::load_network(): Failed to load URL \'%s\' with external commands \'wget\' or \'curl\'."
             ,url);
LAB_0011b93e:
  __cxa_throw(this_00,&CImgIOException::typeinfo,CImgException::~CImgException);
}

Assistant:

inline char *load_network(const char *const url, char *const filename_local,
                            const unsigned int timeout, const bool try_fallback) {
    if (!url)
      throw CImgArgumentException("cimg::load_network(): Specified URL is (null).");
    if (!filename_local)
      throw CImgArgumentException("cimg::load_network(): Specified destination string is (null).");

    const char *const __ext = cimg::split_filename(url), *const _ext = (*__ext && __ext>url)?__ext - 1:__ext;
    CImg<char> ext = CImg<char>::string(_ext);
    std::FILE *file = 0;
    *filename_local = 0;
    if (ext._width>16 || !cimg::strncasecmp(ext,"cgi",3)) *ext = 0;
    else cimg::strwindows_reserved(ext);
    do {
      cimg_snprintf(filename_local,256,"%s%c%s%s",
                    cimg::temporary_path(),cimg_file_separator,cimg::filenamerand(),ext._data);
      if ((file=std::fopen(filename_local,"rb"))!=0) cimg::fclose(file);
    } while (file);

#ifdef cimg_use_curl
    const unsigned int omode = cimg::exception_mode();
    cimg::exception_mode(0);
    try {
      CURL *curl = 0;
      CURLcode res;
      curl = curl_easy_init();
      if (curl) {
        file = cimg::fopen(filename_local,"wb");
        curl_easy_setopt(curl,CURLOPT_URL,url);
        curl_easy_setopt(curl,CURLOPT_WRITEFUNCTION,0);
        curl_easy_setopt(curl,CURLOPT_WRITEDATA,file);
        curl_easy_setopt(curl,CURLOPT_SSL_VERIFYPEER,0L);
        curl_easy_setopt(curl,CURLOPT_SSL_VERIFYHOST,0L);
        curl_easy_setopt(curl,CURLOPT_FOLLOWLOCATION,1L);
        if (timeout) curl_easy_setopt(curl,CURLOPT_TIMEOUT,(long)timeout);
        if (std::strchr(url,'?')) curl_easy_setopt(curl,CURLOPT_HTTPGET,1L);
        res = curl_easy_perform(curl);
        curl_easy_cleanup(curl);
        std::fseek(file,0,SEEK_END); // Check if file size is 0.
        const long siz = std::ftell(file);
        cimg::fclose(file);
        if (siz>0 && res==CURLE_OK) {
          cimg::exception_mode(omode);
          return filename_local;
        } else std::remove(filename_local);
      }
    } catch (...) { }
    cimg::exception_mode(omode);
    if (!try_fallback) throw CImgIOException("cimg::load_network(): Failed to load file '%s' with libcurl.",url);
#endif

    CImg<char> command((unsigned int)std::strlen(url) + 64);
    cimg::unused(try_fallback);

    // Try with 'curl' first.
    if (timeout)
      cimg_snprintf(command,command._width,"%s -m %u -f --silent --compressed -o \"%s\" \"%s\"",
                    cimg::curl_path(),timeout,filename_local,url);
    else
      cimg_snprintf(command,command._width,"%s -f --silent --compressed -o \"%s\" \"%s\"",
                    cimg::curl_path(),filename_local,url);
    cimg::system(command);

    if (!(file = std::fopen(filename_local,"rb"))) {

      // Try with 'wget' otherwise.
      if (timeout)
        cimg_snprintf(command,command._width,"%s -T %u -q -r -l 0 --no-cache -O \"%s\" \"%s\"",
                      cimg::wget_path(),timeout,filename_local,url);
      else
        cimg_snprintf(command,command._width,"%s -q -r -l 0 --no-cache -O \"%s\" \"%s\"",
                      cimg::wget_path(),filename_local,url);
      cimg::system(command);

      if (!(file = std::fopen(filename_local,"rb")))
        throw CImgIOException("cimg::load_network(): Failed to load file '%s' with external commands "
                              "'wget' or 'curl'.",url);
      cimg::fclose(file);

      // Try gunzip it.
      cimg_snprintf(command,command._width,"%s.gz",filename_local);
      std::rename(filename_local,command);
      cimg_snprintf(command,command._width,"%s --quiet \"%s.gz\"",
                    gunzip_path(),filename_local);
      cimg::system(command);
      file = std::fopen(filename_local,"rb");
      if (!file) {
        cimg_snprintf(command,command._width,"%s.gz",filename_local);
        std::rename(command,filename_local);
        file = std::fopen(filename_local,"rb");
      }
    }
    std::fseek(file,0,SEEK_END); // Check if file size is 0.
    if (std::ftell(file)<=0)
      throw CImgIOException("cimg::load_network(): Failed to load URL '%s' with external commands "
                            "'wget' or 'curl'.",url);
    cimg::fclose(file);
    return filename_local;
  }